

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

int Gia_ManGraphToAig(Gia_Man_t *p,Dec_Graph_t *pGraph)

{
  int iVar1;
  int iVar2;
  Dec_Node_t *pDVar3;
  int iAnd1;
  int iAnd0;
  int i;
  Dec_Node_t *pNode;
  Dec_Graph_t *pGraph_local;
  Gia_Man_t *p_local;
  
  _iAnd0 = (Dec_Node_t *)0x0;
  iVar1 = Dec_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Dec_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (iAnd1 = pGraph->nLeaves; iAnd1 < pGraph->nSize; iAnd1 = iAnd1 + 1) {
        _iAnd0 = Dec_GraphNode(pGraph,iAnd1);
        pDVar3 = Dec_GraphNode(pGraph,(uint)_iAnd0->eEdge0 >> 1 & 0x3fffffff);
        iVar1 = Abc_LitNotCond((pDVar3->field_2).iFunc,(uint)_iAnd0->eEdge0 & 1);
        pDVar3 = Dec_GraphNode(pGraph,(uint)_iAnd0->eEdge1 >> 1 & 0x3fffffff);
        iVar2 = Abc_LitNotCond((pDVar3->field_2).iFunc,(uint)_iAnd0->eEdge1 & 1);
        iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
        (_iAnd0->field_2).iFunc = iVar1;
      }
      iVar1 = (_iAnd0->field_2).iFunc;
      iVar2 = Dec_GraphIsComplement(pGraph);
      p_local._4_4_ = Abc_LitNotCond(iVar1,iVar2);
    }
    else {
      pDVar3 = Dec_GraphVar(pGraph);
      iVar1 = (pDVar3->field_2).iFunc;
      iVar2 = Dec_GraphIsComplement(pGraph);
      p_local._4_4_ = Abc_LitNotCond(iVar1,iVar2);
    }
  }
  else {
    iVar1 = Dec_GraphIsComplement(pGraph);
    p_local._4_4_ = Abc_LitNotCond(1,iVar1);
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create GIA for SOP.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManGraphToAig( Gia_Man_t * p, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i, iAnd0, iAnd1;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Dec_GraphVar(pGraph)->iFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        iAnd0 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        iAnd1 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        pNode->iFunc = Gia_ManHashAnd( p, iAnd0, iAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Dec_GraphIsComplement(pGraph) );
}